

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O3

type __thiscall
chrono::ChFunctorArchiveInSpecificPtr<myEmployeeCustomConstructor>::
_archive_in_constructor<myEmployeeCustomConstructor>
          (ChFunctorArchiveInSpecificPtr<myEmployeeCustomConstructor> *this,ChArchiveIn *marchive,
          char *classname)

{
  myEmployeeCustomConstructor **ppmVar1;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  iterator iVar2;
  ChClassFactory *this_01;
  myEmployeeCustomConstructor *pmVar3;
  allocator local_49;
  key_type local_48;
  
  std::__cxx11::string::string((string *)&local_48,classname,&local_49);
  this_00 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)chrono::ChClassFactory::GetGlobalClassFactory();
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(this_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    pmVar3 = (myEmployeeCustomConstructor *)
             myEmployeeCustomConstructor::ArchiveINconstructor(marchive);
    *this->pt2Object = pmVar3;
  }
  else {
    std::__cxx11::string::string((string *)&local_48,classname,&local_49);
    ppmVar1 = this->pt2Object;
    this_01 = (ChClassFactory *)chrono::ChClassFactory::GetGlobalClassFactory();
    pmVar3 = (myEmployeeCustomConstructor *)
             ChClassFactory::_archive_in_create(this_01,&local_48,marchive);
    *ppmVar1 = pmVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

typename enable_if< ChDetect_ArchiveINconstructor<Tc>::value, void >::type
        _archive_in_constructor(ChArchiveIn& marchive, const char* classname) {
            if (ChClassFactory::IsClassRegistered(std::string(classname)))
                ChClassFactory::create(std::string(classname), marchive, pt2Object);
            else
                *pt2Object = static_cast<Tc*> (Tc::ArchiveINconstructor(marchive));
        }